

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::ImageDataParameter::ImageDataParameter(ImageDataParameter *this,ImageDataParameter *from)

{
  void *pvVar1;
  string *psVar2;
  bool bVar3;
  undefined3 uVar4;
  float fVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  bool bVar9;
  bool bVar10;
  undefined2 uVar11;
  uint32 uVar12;
  uint uVar13;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ImageDataParameter_006f9c20;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar13 = (from->_has_bits_).has_bits_[0];
  if (((uVar13 & 1) != 0) &&
     (psVar2 = (from->source_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->source_,psVar2);
    uVar13 = (from->_has_bits_).has_bits_[0];
  }
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar13 & 2) != 0) &&
     (psVar2 = (from->mean_file_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->mean_file_,psVar2);
    uVar13 = (from->_has_bits_).has_bits_[0];
  }
  (this->root_folder_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar13 & 4) != 0) &&
     (psVar2 = (from->root_folder_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->root_folder_,psVar2);
  }
  uVar7 = from->crop_size_;
  uVar8 = from->rand_skip_;
  bVar9 = from->shuffle_;
  bVar10 = from->mirror_;
  uVar11 = *(undefined2 *)&from->field_0x3a;
  uVar12 = from->new_height_;
  bVar3 = from->is_color_;
  uVar4 = *(undefined3 *)&from->field_0x45;
  fVar5 = from->scale_;
  uVar6 = from->batch_size_;
  this->new_width_ = from->new_width_;
  this->is_color_ = bVar3;
  *(undefined3 *)&this->field_0x45 = uVar4;
  this->scale_ = fVar5;
  this->batch_size_ = uVar6;
  this->crop_size_ = uVar7;
  this->rand_skip_ = uVar8;
  this->shuffle_ = bVar9;
  this->mirror_ = bVar10;
  *(undefined2 *)&this->field_0x3a = uVar11;
  this->new_height_ = uVar12;
  return;
}

Assistant:

ImageDataParameter::ImageDataParameter(const ImageDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_mean_file()) {
    mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
  }
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_root_folder()) {
    root_folder_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.root_folder_);
  }
  ::memcpy(&crop_size_, &from.crop_size_,
    reinterpret_cast<char*>(&batch_size_) -
    reinterpret_cast<char*>(&crop_size_) + sizeof(batch_size_));
  // @@protoc_insertion_point(copy_constructor:caffe.ImageDataParameter)
}